

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_node_t * art_node48_insert(art_node48_t *node,art_node_t *child,uint8_t key)

{
  art_node_t aVar1;
  int iVar2;
  art_node256_t *node_00;
  byte in_DL;
  art_node_t *in_RSI;
  art_node_t *in_RDI;
  uint8_t val_idx_1;
  size_t i;
  art_node256_t *new_node;
  uint8_t val_idx;
  ulong local_30;
  undefined8 in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  art_node_t *local_8;
  
  if ((byte)in_RDI[7] < 0x30) {
    iVar2 = roaring_trailing_zeroes(*(unsigned_long_long *)(in_RDI + 8));
    aVar1 = SUB41(iVar2,0);
    in_RDI[(ulong)in_DL + 0x10] = aVar1;
    *(art_node_t **)(in_RDI + (ulong)(byte)aVar1 * 8 + 0x110) = in_RSI;
    in_RDI[7] = (art_node_t)((char)in_RDI[7] + '\x01');
    *(ulong *)(in_RDI + 8) =
         (1L << ((byte)aVar1 & 0x3f) ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 8);
    local_8 = in_RDI;
  }
  else {
    node_00 = art_node256_create((art_key_chunk_t *)
                                 CONCAT17(in_DL,CONCAT16(in_stack_ffffffffffffffe6,
                                                         in_stack_ffffffffffffffe0)),
                                 (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
    for (local_30 = 0; local_30 < 0x100; local_30 = local_30 + 1) {
      if (in_RDI[local_30 + 0x10] != (art_node_t)0x30) {
        art_node256_insert(node_00,*(art_node_t **)
                                    (in_RDI + (ulong)(byte)in_RDI[local_30 + 0x10] * 8 + 0x110),
                           (uint8_t)local_30);
      }
    }
    roaring_free((void *)0x14495b);
    local_8 = art_node256_insert(node_00,in_RSI,in_DL);
  }
  return local_8;
}

Assistant:

static art_node_t *art_node48_insert(art_node48_t *node, art_node_t *child,
                                     uint8_t key) {
    if (node->count < 48) {
        // node->available_children is only zero when the node is full (count ==
        // 48), we just checked count < 48
        uint8_t val_idx = roaring_trailing_zeroes(node->available_children);
        node->keys[key] = val_idx;
        node->children[val_idx] = child;
        node->count++;
        node->available_children &= ~(UINT64_C(1) << val_idx);
        return (art_node_t *)node;
    }
    art_node256_t *new_node =
        art_node256_create(node->base.prefix, node->base.prefix_size);
    for (size_t i = 0; i < 256; ++i) {
        uint8_t val_idx = node->keys[i];
        if (val_idx != ART_NODE48_EMPTY_VAL) {
            art_node256_insert(new_node, node->children[val_idx], i);
        }
    }
    roaring_free(node);
    return art_node256_insert(new_node, child, key);
}